

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

int fio_base64_decode(char *target,char *encoded,int base64_len)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ushort **ppuVar7;
  int *piVar8;
  int iVar9;
  ulong uVar10;
  byte *pbVar11;
  byte *pbVar12;
  ulong uVar13;
  byte *local_38;
  
  local_38 = (byte *)target;
  if (target == (char *)0x0) {
    local_38 = (byte *)encoded;
  }
  if (base64_len < 1) {
    iVar9 = 0;
    goto LAB_00134f6c;
  }
  uVar10 = (ulong)(uint)base64_len;
  do {
    uVar13 = uVar10;
    if (uVar13 == 0) {
      uVar13 = 0;
      break;
    }
    uVar10 = uVar13 - 1;
  } while (base64_decodes[(byte)encoded[uVar13 - 1]] == 0);
  pbVar11 = (byte *)(encoded + (uVar13 & 0xffffffff));
  uVar10 = uVar13 & 0xffffffff;
  while ((iVar9 = (int)uVar10, uVar10 = (ulong)(iVar9 - 1), pbVar12 = pbVar11, iVar9 != 0 &&
         (ppuVar7 = __ctype_b_loc(), pbVar12 = (byte *)encoded,
         (*(byte *)((long)*ppuVar7 + (ulong)(byte)*encoded * 2 + 1) & 0x20) != 0))) {
    encoded = (char *)((byte *)encoded + 1);
    uVar13 = uVar10;
  }
  iVar9 = 0;
  while (iVar6 = (int)uVar13, 3 < iVar6) {
    pbVar11 = pbVar12 + 4;
    if ((((base64_decodes[*pbVar12] == 0) || (uVar3 = base64_decodes[pbVar12[1]], uVar3 == 0)) ||
        (uVar4 = base64_decodes[pbVar12[2]], uVar4 == 0)) ||
       (uVar5 = base64_decodes[pbVar12[3]], uVar5 == 0)) goto LAB_00134f38;
    *local_38 = ((byte)(uVar3 >> 4) & 3) + (char)base64_decodes[*pbVar12] * '\x04';
    local_38[1] = (byte)(uVar4 >> 2) & 0xf | (byte)(uVar3 << 4);
    local_38[2] = (byte)uVar5 & 0x3f | (byte)(uVar4 << 6);
    local_38 = local_38 + 3;
    uVar13 = (ulong)(iVar6 - 4);
    iVar9 = iVar9 + 3;
    pbVar1 = pbVar11 + uVar13;
    while ((pbVar12 = pbVar1, (int)uVar13 != 0 &&
           (ppuVar7 = __ctype_b_loc(), pbVar12 = pbVar11,
           (*(byte *)((long)*ppuVar7 + (long)(char)*pbVar11 * 2 + 1) & 0x20) != 0))) {
      pbVar11 = pbVar11 + 1;
      uVar13 = (ulong)((int)uVar13 - 1);
    }
  }
  if (iVar6 == 3) {
    pbVar11 = pbVar12 + 3;
    if (((base64_decodes[*pbVar12] == 0) || (uVar3 = base64_decodes[pbVar12[1]], uVar3 == 0)) ||
       (uVar4 = base64_decodes[pbVar12[2]], uVar4 == 0)) {
LAB_00134f38:
      pbVar12 = pbVar11;
      piVar8 = __errno_location();
      *piVar8 = 0x22;
    }
    else {
      *local_38 = (char)base64_decodes[*pbVar12] << 2;
      local_38[1] = (byte)(uVar4 >> 2) & 0xf | (byte)(uVar3 << 4);
      local_38[2] = (char)uVar4 << 6;
      local_38 = local_38 + 3;
      iVar9 = iVar9 + 3;
      pbVar12 = pbVar11;
    }
  }
  else if (iVar6 == 2) {
    pbVar11 = pbVar12 + 2;
    if ((base64_decodes[*pbVar12] == 0) || (uVar3 = base64_decodes[pbVar12[1]], uVar3 == 0))
    goto LAB_00134f38;
    *local_38 = (char)base64_decodes[*pbVar12] << 2;
    local_38[1] = (char)uVar3 << 4;
    local_38 = local_38 + 2;
    iVar9 = iVar9 + 2;
    pbVar12 = pbVar11;
  }
  else if (iVar6 == 1) {
    bVar2 = *pbVar12;
    pbVar12 = pbVar12 + 1;
    if (base64_decodes[bVar2] == 0) {
      piVar8 = __errno_location();
      *piVar8 = 0x22;
    }
    else {
      *local_38 = (byte)base64_decodes[bVar2] & 0x3f;
      local_38 = local_38 + 1;
      iVar9 = iVar9 + 1;
    }
  }
  if (pbVar12[-1] == 0x3d) {
    local_38 = local_38 + ~(ulong)(pbVar12[-2] == 0x3d);
    iVar6 = ~(uint)(pbVar12[-2] == 0x3d) + iVar9;
    iVar9 = 0;
    if (0 < iVar6) {
      iVar9 = iVar6;
    }
  }
LAB_00134f6c:
  *local_38 = 0;
  return iVar9;
}

Assistant:

int fio_base64_decode(char *target, char *encoded, int base64_len) {
  if (!target)
    target = encoded;
  if (base64_len <= 0) {
    target[0] = 0;
    return 0;
  }
  int written = 0;
  uint8_t tmp1, tmp2, tmp3, tmp4;
  // skip unknown data at end
  while (base64_len &&
         !base64_decodes[*(uint8_t *)(encoded + (base64_len - 1))]) {
    base64_len--;
  }
  // skip white space
  while (base64_len && isspace((*(uint8_t *)encoded))) {
    base64_len--;
    encoded++;
  }
  while (base64_len >= 4) {
    if (!base64_len) {
      return written;
    }
    tmp1 = *(uint8_t *)(encoded++);
    tmp2 = *(uint8_t *)(encoded++);
    tmp3 = *(uint8_t *)(encoded++);
    tmp4 = *(uint8_t *)(encoded++);
    if (!base64_decodes[tmp1] || !base64_decodes[tmp2] ||
        !base64_decodes[tmp3] || !base64_decodes[tmp4]) {
      errno = ERANGE;
      goto finish;
    }
    *(target++) = (BITVAL(tmp1) << 2) | (BITVAL(tmp2) >> 4);
    *(target++) = (BITVAL(tmp2) << 4) | (BITVAL(tmp3) >> 2);
    *(target++) = (BITVAL(tmp3) << 6) | (BITVAL(tmp4));
    // make sure we don't loop forever.
    base64_len -= 4;
    // count written bytes
    written += 3;
    // skip white space
    while (base64_len && isspace((*encoded))) {
      base64_len--;
      encoded++;
    }
  }
  // deal with the "tail" of the mis-encoded stream - this shouldn't happen
  tmp1 = 0;
  tmp2 = 0;
  tmp3 = 0;
  tmp4 = 0;
  switch (base64_len) {
  case 1:
    tmp1 = *(uint8_t *)(encoded++);
    if (!base64_decodes[tmp1]) {
      errno = ERANGE;
      goto finish;
    }
    *(target++) = BITVAL(tmp1);
    written += 1;
    break;
  case 2:
    tmp1 = *(uint8_t *)(encoded++);
    tmp2 = *(uint8_t *)(encoded++);
    if (!base64_decodes[tmp1] || !base64_decodes[tmp2]) {
      errno = ERANGE;
      goto finish;
    }
    *(target++) = (BITVAL(tmp1) << 2) | (BITVAL(tmp2) >> 6);
    *(target++) = (BITVAL(tmp2) << 4);
    written += 2;
    break;
  case 3:
    tmp1 = *(uint8_t *)(encoded++);
    tmp2 = *(uint8_t *)(encoded++);
    tmp3 = *(uint8_t *)(encoded++);
    if (!base64_decodes[tmp1] || !base64_decodes[tmp2] ||
        !base64_decodes[tmp3]) {
      errno = ERANGE;
      goto finish;
    }
    *(target++) = (BITVAL(tmp1) << 2) | (BITVAL(tmp2) >> 6);
    *(target++) = (BITVAL(tmp2) << 4) | (BITVAL(tmp3) >> 2);
    *(target++) = BITVAL(tmp3) << 6;
    written += 3;
    break;
  }
finish:
  if (encoded[-1] == '=') {
    target--;
    written--;
    if (encoded[-2] == '=') {
      target--;
      written--;
    }
    if (written < 0)
      written = 0;
  }
  *target = 0;
  return written;
}